

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O2

ZDD zdd_cover_enum_first(ZDD dd,int32_t *arr)

{
  undefined8 uVar1;
  long lVar2;
  
  if (dd != 0) {
    lVar2 = (dd & 0xffffffffff) * 0x10;
    uVar1 = *(undefined8 *)(nodes->data + lVar2 + 8);
    dd = zdd_cover_enum_first(*(ulong *)(nodes->data + lVar2) & 0x800000ffffffffff,arr + 1);
    if (dd == 0) {
      __assert_fail("res != zdd_false",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_zdd.c"
                    ,0x921,"ZDD zdd_cover_enum_first(ZDD, int32_t *)");
    }
    *arr = (uint)((ulong)uVar1 >> 0x28);
  }
  return dd;
}

Assistant:

ZDD
zdd_cover_enum_first(ZDD dd, int32_t *arr)
{
    if (dd == zdd_false) {
        return zdd_false;
    } else if (dd == zdd_true) {
        *arr = -1;
        return zdd_true;
    } else {
        const zddnode_t dd_node = ZDD_GETNODE(dd);
        const uint32_t dd_var = zddnode_getvariable(dd_node);

        ZDD res = zdd_cover_enum_first(zddnode_high(dd, dd_node), arr+1);
        // this cannot return False; following high edges must always lead to zdd_true!
        assert(res != zdd_false);

        *arr = dd_var;
        return res;
    }
}